

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

void conversion(void)

{
  uint *puVar1;
  SqStack P;
  SqStack S_00;
  undefined8 in_stack_ffffffffffffffa0;
  undefined1 local_58 [24];
  ElementType *local_40;
  ElementType *local_38;
  ElementType *local_30;
  ElementType *local_28;
  SqStack S;
  int N;
  
  S_00.top = S.top;
  S_00.base = S.base;
  S_00._16_8_ = in_stack_ffffffffffffffa0;
  InitStack(S_00);
  local_28 = local_40;
  S.base = local_38;
  S.top = local_30;
  __isoc99_scanf("%d",&S.field_0x14);
  for (; S._20_4_ != 0; S._20_4_ = (int)S._20_4_ / 8) {
    P.top = S.base;
    P.base = local_28;
    P._16_8_ = S.top;
    Push((SqStack *)local_58,P,(int)S._20_4_ % 8);
    local_28 = (ElementType *)local_58._0_8_;
    S.base = (ElementType *)local_58._8_8_;
    S.top = (ElementType *)local_58._16_8_;
  }
  while (S.base != local_28) {
    puVar1 = (uint *)(S.base + -1);
    S.base = S.base + -1;
    printf("%d",(ulong)*puVar1);
  }
  return;
}

Assistant:

void conversion(){
    int N;  //十进制整数
    SqStack S;
    S = InitStack(S);   //构造空栈
    scanf("%d",&N);
    while(N){
        S = Push(S,N % 8);
        N = N / 8;
    }
    while(S.top != S.base){
        printf("%d",*--S.top);
    }
}